

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

t_symbol * dogensym(char *s,t_symbol *oldsym,_pdinstance *pdinstance)

{
  t_symbol *ptVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *__dest;
  char cVar5;
  t_symbol *ptVar6;
  _symbol **pp_Var7;
  size_t nbytes;
  
  cVar5 = *s;
  if (cVar5 == '\0') {
    nbytes = 1;
    uVar4 = 0x1505;
  }
  else {
    uVar2 = 0x1505;
    nbytes = 1;
    do {
      uVar2 = (int)cVar5 + uVar2 * 0x21;
      cVar5 = s[nbytes];
      nbytes = nbytes + 1;
    } while (cVar5 != '\0');
    uVar4 = (ulong)(uVar2 & 0x3fff);
  }
  ptVar1 = pd_maininstance.pd_symhash[uVar4];
  if (pd_maininstance.pd_symhash[uVar4] == (t_symbol *)0x0) {
    pp_Var7 = pd_maininstance.pd_symhash + uVar4;
  }
  else {
    do {
      ptVar6 = ptVar1;
      iVar3 = strcmp(ptVar6->s_name,s);
      if (iVar3 == 0) {
        return ptVar6;
      }
      ptVar1 = ptVar6->s_next;
    } while (ptVar6->s_next != (_symbol *)0x0);
    pp_Var7 = &ptVar6->s_next;
  }
  if (oldsym == (t_symbol *)0x0) {
    oldsym = (t_symbol *)getbytes(0x18);
  }
  __dest = (char *)getbytes(nbytes);
  oldsym->s_thing = (_class **)0x0;
  oldsym->s_next = (_symbol *)0x0;
  strcpy(__dest,s);
  oldsym->s_name = __dest;
  *pp_Var7 = oldsym;
  return oldsym;
}

Assistant:

static t_symbol *dogensym(const char *s, t_symbol *oldsym,
    t_pdinstance *pdinstance)
{
    char *symname = 0;
    t_symbol **symhashloc, *sym2;
    unsigned int hash = 5381;
    int length = 0;
    const char *s2 = s;
    while (*s2) /* djb2 hash algo */
    {
        hash = ((hash << 5) + hash) + *s2;
        length++;
        s2++;
    }
    symhashloc = pdinstance->pd_symhash + (hash & (SYMTABHASHSIZE-1));
    while ((sym2 = *symhashloc))
    {
        if (!strcmp(sym2->s_name, s))
            return(sym2);
        symhashloc = &sym2->s_next;
    }
    if (oldsym)
        sym2 = oldsym;
    else sym2 = (t_symbol *)t_getbytes(sizeof(*sym2));
    symname = t_getbytes(length+1);
    sym2->s_next = 0;
    sym2->s_thing = 0;
    strcpy(symname, s);
    sym2->s_name = symname;
    *symhashloc = sym2;
    return (sym2);
}